

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bilinear_apply_interpolation.h
# Opt level: O3

void ncnn::gridsample_3d_bilinear_apply_interpolation_p8
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  undefined1 (*pauVar9) [32];
  int *offset_ptr;
  int *piVar10;
  float fVar11;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [32];
  undefined1 auVar28 [28];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 in_ZMM9 [64];
  undefined1 auVar31 [64];
  
  iVar3 = dst->c;
  if (0 < (long)iVar3) {
    iVar5 = dst->h * dst->w * dst->d;
    lVar7 = 0;
    do {
      if (0 < iVar5) {
        lVar8 = src->cstep * lVar7 * src->elemsize;
        pvVar4 = src->data;
        piVar10 = (int *)offset_value->data;
        pauVar9 = (undefined1 (*) [32])(dst->cstep * lVar7 * dst->elemsize + (long)dst->data);
        iVar6 = iVar5;
        do {
          fVar16 = 0.0;
          fVar17 = 0.0;
          fVar11 = 0.0;
          fVar15 = 0.0;
          fVar18 = 0.0;
          fVar19 = 0.0;
          fVar20 = 0.0;
          fVar21 = 0.0;
          auVar22 = ZEXT832(0) << 0x40;
          if (-1 < (long)*piVar10) {
            auVar22 = *(undefined1 (*) [32])((long)pvVar4 + (long)*piVar10 * 4 + lVar8);
          }
          if (-1 < (long)piVar10[1]) {
            pfVar1 = (float *)((long)pvVar4 + (long)piVar10[1] * 4 + lVar8);
            fVar11 = *pfVar1;
            fVar15 = pfVar1[1];
            fVar16 = pfVar1[2];
            fVar17 = pfVar1[3];
            fVar18 = pfVar1[4];
            fVar19 = pfVar1[5];
            fVar20 = pfVar1[6];
            fVar21 = pfVar1[7];
          }
          auVar14 = ZEXT1632(ZEXT816(0) << 0x40);
          auVar25 = ZEXT1664(ZEXT816(0) << 0x40);
          if (-1 < (long)piVar10[2]) {
            auVar25 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar4 + (long)piVar10[2] * 4 + lVar8));
          }
          if (-1 < (long)piVar10[3]) {
            auVar14 = *(undefined1 (*) [32])((long)pvVar4 + (long)piVar10[3] * 4 + lVar8);
          }
          auVar28 = ZEXT1628(ZEXT816(0) << 0x40);
          auVar29 = ZEXT1664(ZEXT816(0) << 0x40);
          if (-1 < (long)piVar10[4]) {
            auVar29 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar4 + (long)piVar10[4] * 4 + lVar8));
          }
          if (-1 < (long)piVar10[5]) {
            auVar28 = SUB3228(*(undefined1 (*) [32])((long)pvVar4 + (long)piVar10[5] * 4 + lVar8),0)
            ;
          }
          auVar23 = ZEXT1632(ZEXT816(0) << 0x40);
          auVar13 = ZEXT1632(ZEXT816(0) << 0x40);
          if (-1 < (long)piVar10[6]) {
            auVar13 = *(undefined1 (*) [32])((long)pvVar4 + (long)piVar10[6] * 4 + lVar8);
          }
          if (-1 < (long)piVar10[7]) {
            auVar23 = *(undefined1 (*) [32])((long)pvVar4 + (long)piVar10[7] * 4 + lVar8);
          }
          fVar2 = (float)piVar10[8];
          auVar31._0_4_ = fVar2 * auVar22._0_4_;
          auVar31._4_4_ = fVar2 * auVar22._4_4_;
          auVar31._8_4_ = fVar2 * auVar22._8_4_;
          auVar31._12_4_ = fVar2 * auVar22._12_4_;
          auVar31._16_4_ = fVar2 * auVar22._16_4_;
          auVar31._20_4_ = fVar2 * auVar22._20_4_;
          auVar31._28_36_ = in_ZMM9._28_36_;
          auVar31._24_4_ = fVar2 * auVar22._24_4_;
          in_ZMM9 = ZEXT3264(auVar31._0_32_);
          auVar22 = vsubps_avx(auVar22,auVar31._0_32_);
          auVar12._0_4_ = auVar22._0_4_ + fVar2 * fVar11;
          auVar12._4_4_ = auVar22._4_4_ + fVar2 * fVar15;
          auVar12._8_4_ = auVar22._8_4_ + fVar2 * fVar16;
          auVar12._12_4_ = auVar22._12_4_ + fVar2 * fVar17;
          auVar12._16_4_ = auVar22._16_4_ + fVar2 * fVar18;
          auVar12._20_4_ = auVar22._20_4_ + fVar2 * fVar19;
          auVar12._24_4_ = auVar22._24_4_ + fVar2 * fVar20;
          auVar12._28_4_ = auVar22._28_4_ + fVar21;
          auVar22 = vsubps_avx(auVar14,auVar25._0_32_);
          auVar26._0_4_ = fVar2 * auVar29._0_4_;
          auVar26._4_4_ = fVar2 * auVar29._4_4_;
          auVar26._8_4_ = fVar2 * auVar29._8_4_;
          auVar26._12_4_ = fVar2 * auVar29._12_4_;
          auVar26._16_4_ = fVar2 * auVar29._16_4_;
          auVar26._20_4_ = fVar2 * auVar29._20_4_;
          auVar26._28_36_ = auVar25._28_36_;
          auVar26._24_4_ = fVar2 * auVar29._24_4_;
          auVar27 = vsubps_avx(auVar29._0_32_,auVar26._0_32_);
          auVar24._0_4_ = auVar27._0_4_ + fVar2 * auVar28._0_4_;
          auVar24._4_4_ = auVar27._4_4_ + fVar2 * auVar28._4_4_;
          auVar24._8_4_ = auVar27._8_4_ + fVar2 * auVar28._8_4_;
          auVar24._12_4_ = auVar27._12_4_ + fVar2 * auVar28._12_4_;
          auVar24._16_4_ = auVar27._16_4_ + fVar2 * auVar28._16_4_;
          auVar24._20_4_ = auVar27._20_4_ + fVar2 * auVar28._20_4_;
          auVar24._24_4_ = auVar27._24_4_ + fVar2 * auVar28._24_4_;
          auVar24._28_4_ = auVar27._28_4_ + auVar14._28_4_;
          auVar14 = vsubps_avx(auVar23,auVar13);
          auVar27._0_4_ = fVar2 * auVar14._0_4_ + auVar13._0_4_;
          auVar27._4_4_ = fVar2 * auVar14._4_4_ + auVar13._4_4_;
          auVar27._8_4_ = fVar2 * auVar14._8_4_ + auVar13._8_4_;
          auVar27._12_4_ = fVar2 * auVar14._12_4_ + auVar13._12_4_;
          auVar27._16_4_ = fVar2 * auVar14._16_4_ + auVar13._16_4_;
          auVar27._20_4_ = fVar2 * auVar14._20_4_ + auVar13._20_4_;
          auVar27._24_4_ = fVar2 * auVar14._24_4_ + auVar13._24_4_;
          auVar27._28_4_ = auVar14._28_4_ + auVar13._28_4_;
          fVar11 = (float)piVar10[9];
          auVar30._0_4_ = auVar12._0_4_ * fVar11;
          auVar30._4_4_ = auVar12._4_4_ * fVar11;
          auVar30._8_4_ = auVar12._8_4_ * fVar11;
          auVar30._12_4_ = auVar12._12_4_ * fVar11;
          auVar30._16_4_ = auVar12._16_4_ * fVar11;
          auVar30._20_4_ = auVar12._20_4_ * fVar11;
          auVar30._28_36_ = auVar29._28_36_;
          auVar30._24_4_ = auVar12._24_4_ * fVar11;
          auVar14 = vsubps_avx(auVar12,auVar30._0_32_);
          auVar13._0_4_ = auVar14._0_4_ + (fVar2 * auVar22._0_4_ + auVar25._0_4_) * fVar11;
          auVar13._4_4_ = auVar14._4_4_ + (fVar2 * auVar22._4_4_ + auVar25._4_4_) * fVar11;
          auVar13._8_4_ = auVar14._8_4_ + (fVar2 * auVar22._8_4_ + auVar25._8_4_) * fVar11;
          auVar13._12_4_ = auVar14._12_4_ + (fVar2 * auVar22._12_4_ + auVar25._12_4_) * fVar11;
          auVar13._16_4_ = auVar14._16_4_ + (fVar2 * auVar22._16_4_ + auVar25._16_4_) * fVar11;
          auVar13._20_4_ = auVar14._20_4_ + (fVar2 * auVar22._20_4_ + auVar25._20_4_) * fVar11;
          auVar13._24_4_ = auVar14._24_4_ + (fVar2 * auVar22._24_4_ + auVar25._24_4_) * fVar11;
          auVar13._28_4_ = auVar14._28_4_ + auVar22._28_4_ + auVar25._28_4_;
          auVar22 = vsubps_avx(auVar27,auVar24);
          fVar15 = (float)piVar10[10];
          auVar23._0_4_ = auVar22._0_4_ * fVar11 + auVar24._0_4_;
          auVar23._4_4_ = auVar22._4_4_ * fVar11 + auVar24._4_4_;
          auVar23._8_4_ = auVar22._8_4_ * fVar11 + auVar24._8_4_;
          auVar23._12_4_ = auVar22._12_4_ * fVar11 + auVar24._12_4_;
          auVar23._16_4_ = auVar22._16_4_ * fVar11 + auVar24._16_4_;
          auVar23._20_4_ = auVar22._20_4_ * fVar11 + auVar24._20_4_;
          auVar23._24_4_ = auVar22._24_4_ * fVar11 + auVar24._24_4_;
          auVar23._28_4_ = auVar22._28_4_ + auVar24._28_4_;
          auVar22 = vsubps_avx(auVar23,auVar13);
          auVar14._0_4_ = auVar22._0_4_ * fVar15 + auVar13._0_4_;
          auVar14._4_4_ = auVar22._4_4_ * fVar15 + auVar13._4_4_;
          auVar14._8_4_ = auVar22._8_4_ * fVar15 + auVar13._8_4_;
          auVar14._12_4_ = auVar22._12_4_ * fVar15 + auVar13._12_4_;
          auVar14._16_4_ = auVar22._16_4_ * fVar15 + auVar13._16_4_;
          auVar14._20_4_ = auVar22._20_4_ * fVar15 + auVar13._20_4_;
          auVar14._24_4_ = auVar22._24_4_ * fVar15 + auVar13._24_4_;
          auVar14._28_4_ = auVar22._28_4_ + auVar13._28_4_;
          *pauVar9 = auVar14;
          pauVar9 = pauVar9 + 1;
          piVar10 = piVar10 + 0xb;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar3);
  }
  return;
}

Assistant:

static void gridsample_3d_bilinear_apply_interpolation_p8(const Mat& src, Mat& dst, const Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int outd = dst.d;
    const int grid_size = outw * outh * outd;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const float* offset_value_ptr = offset_value.channel(0);

        for (int i = 0; i < grid_size; i++)
        {
            const int* offset_ptr = (int*)offset_value_ptr;
            const float* value_ptr = offset_value_ptr + 8;

            __m256 v000_val = offset_ptr[0] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[0]) : _mm256_set1_ps(0);
            __m256 v001_val = offset_ptr[1] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[1]) : _mm256_set1_ps(0);
            __m256 v010_val = offset_ptr[2] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[2]) : _mm256_set1_ps(0);
            __m256 v011_val = offset_ptr[3] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[3]) : _mm256_set1_ps(0);

            __m256 v100_val = offset_ptr[4] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[4]) : _mm256_set1_ps(0);
            __m256 v101_val = offset_ptr[5] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[5]) : _mm256_set1_ps(0);
            __m256 v110_val = offset_ptr[6] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[6]) : _mm256_set1_ps(0);
            __m256 v111_val = offset_ptr[7] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[7]) : _mm256_set1_ps(0);

            __m256 value = _mm256_set1_ps(value_ptr[0]);
            __m256 v00 = _mm256_comp_fmadd_ps(v001_val, value, _mm256_comp_fnmadd_ps(v000_val, value, v000_val));
            __m256 v01 = _mm256_comp_fmadd_ps(v011_val, value, _mm256_comp_fnmadd_ps(v010_val, value, v010_val));
            __m256 v10 = _mm256_comp_fmadd_ps(v101_val, value, _mm256_comp_fnmadd_ps(v100_val, value, v100_val));
            __m256 v11 = _mm256_comp_fmadd_ps(v111_val, value, _mm256_comp_fnmadd_ps(v110_val, value, v110_val));

            value = _mm256_set1_ps(value_ptr[1]);
            __m256 v0 = _mm256_comp_fmadd_ps(v01, value, _mm256_comp_fnmadd_ps(v00, value, v00));
            __m256 v1 = _mm256_comp_fmadd_ps(v11, value, _mm256_comp_fnmadd_ps(v10, value, v10));

            value = _mm256_set1_ps(value_ptr[2]);
            __m256 _v = _mm256_comp_fmadd_ps(v1, value, _mm256_comp_fnmadd_ps(v0, value, v0));
            _mm256_storeu_ps(dstptr, _v);

            dstptr += 8;
            offset_value_ptr += 11;
        }
    }
}